

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMulti.c
# Opt level: O0

int Gia_ManCountConst0Pos(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Saig_ManPoNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_1c);
    pAVar2 = Aig_ObjChild0(pAVar2);
    pAVar3 = Aig_ManConst0(p);
    local_20 = (uint)(pAVar2 == pAVar3) + local_20;
  }
  return local_20;
}

Assistant:

int Gia_ManCountConst0Pos( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Saig_ManForEachPo( p, pObj, i )
        Counter += (Aig_ObjChild0(pObj) == Aig_ManConst0(p));
    return Counter;
}